

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int *piVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Mat *kernel_tm_00;
  Mat *pMVar20;
  Option *opt_00;
  uint uVar21;
  void *pvVar22;
  int iVar23;
  void *pvVar24;
  long lVar25;
  void *pvVar26;
  long lVar27;
  float *pfVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  int iVar32;
  float *pfVar33;
  long lVar34;
  float *pfVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  void *pvVar41;
  ulong uVar42;
  void *pvVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [12];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  void *local_340;
  void *local_338;
  void *local_330;
  void *local_328;
  void *local_320;
  void *local_310;
  void *local_308;
  void *local_300;
  void *local_2f8;
  long local_2f0;
  void *local_2e8;
  void *local_2e0;
  float *local_2d8;
  long local_2d0;
  void *local_2c8;
  void *local_2c0;
  undefined1 local_2b8 [16];
  Mat local_2a8;
  Mat *local_260;
  void *local_258;
  long local_250;
  long local_248;
  ulong local_240;
  Mat local_238;
  Mat *local_1e8;
  Option *local_1e0;
  Mat local_1d8;
  Mat local_188;
  undefined1 local_138 [16];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  float afStack_108 [6];
  float afStack_f0 [6];
  float afStack_d8 [6];
  float afStack_c0 [6];
  float afStack_a8 [6];
  float afStack_90 [6];
  Option opt_b;
  
  iVar23 = bottom_blob->c;
  uVar5 = top_blob->w;
  uVar7 = top_blob->h;
  auVar44._4_4_ = uVar7;
  auVar44._0_4_ = uVar5;
  iVar32 = top_blob->c;
  piVar9 = bottom_blob->refcount;
  local_238.data = bottom_blob->data;
  local_238.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_238.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_238.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_238.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_238.elempack = bottom_blob->elempack;
  local_238.allocator = bottom_blob->allocator;
  uVar12 = bottom_blob->dims;
  uVar13 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  uVar15 = bottom_blob->d;
  local_238.cstep = bottom_blob->cstep;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + 1;
    UNLOCK();
  }
  auVar47._8_4_ = 3;
  auVar47._0_8_ = 0x300000003;
  auVar47._12_4_ = 3;
  auVar44._8_8_ = 0;
  auVar44 = vpaddd_avx(auVar44,auVar47);
  auVar48 = vpsrad_avx(auVar44,0x1f);
  auVar48 = vpsrld_avx(auVar48,0x1e);
  local_2b8 = vpaddd_avx(auVar44,auVar48);
  auVar48._8_4_ = 0xfffffffc;
  auVar48._0_8_ = 0xfffffffcfffffffc;
  auVar48._12_4_ = 0xfffffffc;
  local_138 = vpand_avx(local_2b8,auVar48);
  local_118 = (ulong)local_138._4_4_;
  local_120 = CONCAT44((int)(local_238.cstep >> 0x20),local_138._0_4_);
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  auVar48 = opt_b._32_16_;
  local_238.dims = uVar12;
  local_238.w = uVar13;
  local_238.h = uVar14;
  local_238.d = uVar15;
  local_238.c = iVar23;
  local_110 = bias;
  copy_make_border(bottom_blob,&local_238,0,(local_138._4_4_ + 2) - bottom_blob->h,0,
                   (local_138._0_4_ + 2) - bottom_blob->w,0,0.0,&opt_b);
  local_258 = (void *)CONCAT44(local_258._4_4_,iVar32);
  auVar44 = vpsrad_avx(local_2b8,2);
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  local_260 = kernel_tm;
  local_1e8 = top_blob;
  local_1e0 = opt;
  Mat::create(&local_1d8,auVar44._4_4_ * auVar44._0_4_,0x24,iVar23,4,opt->workspace_allocator);
  opt_00 = local_1e0;
  pMVar20 = local_1e8;
  kernel_tm_00 = local_260;
  if (0 < (long)local_238.c) {
    iVar23 = local_238.h + 1;
    if (-1 < local_238.h + -2) {
      iVar23 = local_238.h + -2;
    }
    uVar21 = iVar23 >> 2;
    iVar23 = local_238.w + 1;
    if (-1 < local_238.w + -2) {
      iVar23 = local_238.w + -2;
    }
    uVar37 = iVar23 >> 2;
    iVar23 = uVar37 * uVar21;
    uVar36 = 1;
    if (1 < (int)uVar37) {
      uVar36 = (ulong)uVar37;
    }
    uVar42 = 1;
    if (1 < (int)uVar21) {
      uVar42 = (ulong)uVar21;
    }
    local_2d8 = (float *)((long)local_238.data + 0x14);
    local_250 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize) * local_1d8.cstep;
    local_240 = (long)(int)uVar37 * 4;
    local_320 = (void *)((long)local_1d8.data + (long)iVar23 * 4);
    local_328 = (void *)((long)local_1d8.data + (long)(iVar23 * 2) * 4);
    local_330 = (void *)((long)local_1d8.data + (long)(iVar23 * 3) * 4);
    local_338 = (void *)((long)local_1d8.data + (long)(iVar23 * 4) * 4);
    local_2e0 = local_1d8.data;
    local_340 = (void *)((long)local_1d8.data + (long)(iVar23 * 5) * 4);
    auVar48 = SUB6416(ZEXT464(0xc0a00000),0);
    lVar40 = 0;
    do {
      local_248 = lVar40;
      if (5 < local_238.h) {
        local_2b8._0_8_ = local_340;
        local_2c0 = local_338;
        local_2f8 = local_330;
        local_300 = local_328;
        local_308 = local_320;
        local_310 = local_2e0;
        uVar30 = 0;
        pfVar35 = local_2d8;
        do {
          if (5 < local_238.w) {
            uVar38 = 0;
            pvVar22 = local_2f8;
            pvVar24 = local_2c0;
            pvVar26 = local_310;
            lVar40 = local_2b8._0_8_;
            pfVar28 = pfVar35;
            pvVar41 = local_308;
            pvVar43 = local_300;
            do {
              lVar25 = -0x18;
              pfVar33 = pfVar28;
              do {
                fVar49 = pfVar33[-4];
                fVar1 = pfVar33[-3];
                fVar2 = pfVar33[-2];
                fVar3 = pfVar33[-1];
                fVar10 = (fVar49 - fVar2) + (fVar49 - fVar2);
                fVar4 = *pfVar33;
                *(float *)((long)afStack_f0 + lVar25) = fVar1 * -5.0 + fVar3 + pfVar33[-5] * 4.0;
                *(float *)((long)afStack_d8 + lVar25) = fVar3 + fVar2 + (fVar1 + fVar49) * -4.0;
                *(float *)((long)afStack_c0 + lVar25) = (fVar3 - fVar2) + (fVar49 - fVar1) * 4.0;
                *(float *)((long)afStack_a8 + lVar25) = (fVar3 - fVar1) - fVar10;
                *(float *)((long)afStack_90 + lVar25) = fVar10 + (fVar3 - fVar1);
                *(float *)(&opt_b.lightmode + lVar25) = fVar2 * -5.0 + fVar49 * 4.0 + fVar4;
                pfVar33 = pfVar33 + local_238.w;
                lVar25 = lVar25 + 4;
              } while (lVar25 != 0);
              lVar25 = 0x14;
              lVar34 = 0;
              do {
                fVar49 = *(float *)((long)&local_118 + lVar25);
                fVar1 = *(float *)((long)&local_118 + lVar25 + 4);
                fVar2 = *(float *)((long)afStack_108 + lVar25 + -8);
                fVar3 = *(float *)((long)afStack_108 + lVar25 + -4);
                fVar10 = (fVar49 - fVar2) + (fVar49 - fVar2);
                fVar4 = *(float *)((long)afStack_108 + lVar25);
                *(float *)((long)pvVar26 + lVar34) =
                     fVar1 * -5.0 + fVar3 + *(float *)((long)&local_120 + lVar25 + 4) * 4.0;
                *(float *)((long)pvVar41 + lVar34) = fVar3 + fVar2 + (fVar1 + fVar49) * -4.0;
                *(float *)((long)pvVar43 + lVar34) = (fVar3 - fVar2) + (fVar49 - fVar1) * 4.0;
                *(float *)((long)pvVar22 + lVar34) = (fVar3 - fVar1) - fVar10;
                *(float *)((long)pvVar24 + lVar34) = fVar10 + (fVar3 - fVar1);
                *(float *)(lVar40 + lVar34) = fVar2 * -5.0 + fVar49 * 4.0 + fVar4;
                lVar25 = lVar25 + 0x18;
                lVar34 = lVar34 + (long)(iVar23 * 6) * 4;
              } while (lVar25 != 0xa4);
              uVar38 = uVar38 + 1;
              pfVar28 = pfVar28 + 4;
              pvVar26 = (void *)((long)pvVar26 + 4);
              pvVar41 = (void *)((long)pvVar41 + 4);
              pvVar43 = (void *)((long)pvVar43 + 4);
              pvVar22 = (void *)((long)pvVar22 + 4);
              pvVar24 = (void *)((long)pvVar24 + 4);
              lVar40 = lVar40 + 4;
            } while (uVar38 != uVar36);
          }
          uVar30 = uVar30 + 1;
          pfVar35 = pfVar35 + CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize) *
                              (long)local_238.w;
          local_310 = (void *)((long)local_310 + local_240);
          local_308 = (void *)((long)local_308 + local_240);
          local_300 = (void *)((long)local_300 + local_240);
          local_2f8 = (void *)((long)local_2f8 + local_240);
          local_2c0 = (void *)((long)local_2c0 + local_240);
          local_2b8._0_8_ = local_2b8._0_8_ + local_240;
        } while (uVar30 != uVar42);
      }
      local_2d8 = (float *)((long)local_2d8 +
                           local_238.cstep *
                           CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize));
      local_2e0 = (void *)((long)local_2e0 + local_250);
      local_320 = (void *)((long)local_320 + local_250);
      local_328 = (void *)((long)local_328 + local_250);
      local_330 = (void *)((long)local_330 + local_250);
      local_338 = (void *)((long)local_338 + local_250);
      local_340 = (void *)((long)local_340 + local_250);
      lVar40 = local_248 + 1;
    } while (local_248 + 1 != (long)local_238.c);
  }
  piVar9 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  iVar23 = (int)local_258;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_238.cstep = 0;
  local_238.data = (void *)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = 0;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize = 0;
  local_188.elempack = 0;
  local_188.allocator = (Allocator *)0x0;
  local_188.dims = 0;
  local_188.w = 0;
  local_188.h = 0;
  local_188.d = 0;
  local_188.c = 0;
  convolution_winograd_dot_sse(&local_1d8,iVar23,kernel_tm_00,&local_188,opt_00);
  local_2a8.cstep = 0;
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.allocator = (Allocator *)0x0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  uVar6 = pMVar20->w;
  uVar8 = pMVar20->h;
  auVar45._4_4_ = uVar8;
  auVar45._0_4_ = uVar6;
  auVar45._8_8_ = 0;
  auVar44 = vpcmpeqd_avx(auVar45,local_138);
  auVar47 = vpmovsxdq_avx(auVar44);
  auVar44 = vpcmpeqd_avx(auVar48,auVar48);
  if (((auVar44 & ~auVar47) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar44 & ~auVar47,0xf)) {
    if (&local_2a8 != pMVar20) {
      piVar9 = pMVar20->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      local_2a8.data = pMVar20->data;
      local_2a8.refcount._0_4_ = SUB84(pMVar20->refcount,0);
      local_2a8.refcount._4_4_ = (undefined4)((ulong)pMVar20->refcount >> 0x20);
      local_2a8.elemsize._0_4_ = (undefined4)pMVar20->elemsize;
      local_2a8.elemsize._4_4_ = (undefined4)(pMVar20->elemsize >> 0x20);
      local_2a8.elempack = pMVar20->elempack;
      local_2a8.allocator = pMVar20->allocator;
      uVar16 = pMVar20->dims;
      uVar17 = pMVar20->w;
      uVar18 = pMVar20->h;
      uVar19 = pMVar20->d;
      local_2a8.c = pMVar20->c;
      local_2a8.cstep = pMVar20->cstep;
      local_2a8.dims = uVar16;
      local_2a8.w = uVar17;
      local_2a8.h = uVar18;
      local_2a8.d = uVar19;
    }
  }
  else {
    Mat::create(&local_2a8,(int)local_120,(int)local_118,iVar23,4,opt_00->workspace_allocator);
  }
  local_250 = (long)local_2a8.c;
  if (0 < local_250) {
    local_258 = local_110->data;
    iVar23 = local_2a8.h + 3;
    if (-1 < local_2a8.h) {
      iVar23 = local_2a8.h;
    }
    local_240 = (ulong)(uint)(iVar23 >> 2);
    iVar32 = local_2a8.w + 3;
    if (-1 < local_2a8.w) {
      iVar32 = local_2a8.w;
    }
    uVar21 = iVar32 >> 2;
    iVar23 = (iVar23 >> 2) * uVar21;
    local_260 = (Mat *)(local_188.elemsize * local_188.cstep);
    local_328 = (void *)((long)local_188.data + (long)iVar23 * 4);
    local_330 = (void *)((long)local_188.data + (long)(iVar23 * 2) * 4);
    local_338 = (void *)((long)local_188.data + (long)(iVar23 * 3) * 4);
    local_340 = (void *)((long)local_188.data + (long)(iVar23 * 4) * 4);
    local_2e8 = (void *)((long)local_188.data + (long)(iVar23 * 5) * 4);
    local_320 = (void *)((long)local_2a8.data + 0xc);
    lVar25 = local_2a8.cstep * CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
    local_138._0_8_ = lVar25;
    lVar29 = CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) * (long)local_2a8.w;
    local_248 = lVar29 * 4;
    lVar40 = (ulong)uVar21 * 4;
    local_2f0 = 0;
    lVar34 = 0;
    do {
      if (local_258 == (void *)0x0) {
        fVar49 = 0.0;
      }
      else {
        fVar49 = *(float *)((long)local_258 + lVar34 * 4);
      }
      if (3 < local_2a8.h) {
        local_2b8._0_8_ = local_320;
        local_2f8 = local_2e8;
        local_300 = local_340;
        local_308 = local_338;
        local_310 = local_330;
        local_2c8 = local_328;
        local_2d0 = local_2f0;
        uVar36 = 0;
        do {
          if (3 < local_2a8.w) {
            uVar42 = 0;
            pvVar22 = local_300;
            pvVar24 = local_2f8;
            pvVar26 = local_310;
            pfVar35 = (float *)local_2b8._0_8_;
            pvVar41 = local_2c8;
            lVar39 = local_2d0;
            pvVar43 = local_308;
            do {
              lVar27 = -0x18;
              lVar31 = 0;
              do {
                fVar1 = *(float *)((long)pvVar41 + lVar31 * 4);
                fVar2 = *(float *)((long)pvVar26 + lVar31 * 4);
                fVar3 = *(float *)((long)pvVar43 + lVar31 * 4);
                fVar4 = *(float *)((long)pvVar22 + lVar31 * 4);
                fVar10 = fVar2 + fVar1;
                fVar1 = fVar1 - fVar2;
                fVar11 = fVar4 + fVar3;
                fVar3 = fVar3 - fVar4;
                fVar2 = *(float *)((long)pvVar24 + lVar31 * 4);
                *(float *)((long)afStack_f0 + lVar27) =
                     fVar10 + *(float *)((long)local_188.data + lVar31 * 4 + lVar39) + fVar11;
                *(float *)((long)afStack_d8 + lVar27) = fVar3 + fVar3 + fVar1;
                *(float *)((long)afStack_c0 + lVar27) = fVar11 * 4.0 + fVar10;
                *(float *)((long)afStack_a8 + lVar27) = fVar1 + fVar2 + fVar3 * 8.0;
                lVar31 = lVar31 + iVar23 * 6;
                lVar27 = lVar27 + 4;
              } while (lVar27 != 0);
              lVar27 = 0x14;
              pfVar28 = pfVar35;
              do {
                fVar1 = *(float *)((long)&local_118 + lVar27 + 4);
                fVar2 = *(float *)((long)afStack_108 + lVar27 + -8);
                fVar3 = *(float *)((long)afStack_108 + lVar27 + -4);
                fVar4 = fVar3 + fVar2;
                fVar2 = fVar2 - fVar3;
                fVar3 = *(float *)((long)&local_118 + lVar27) + fVar49 + fVar1;
                fVar10 = (*(float *)((long)&local_118 + lVar27) - fVar1) + fVar49;
                fVar1 = *(float *)((long)afStack_108 + lVar27);
                pfVar28[-3] = fVar4 + fVar3 + *(float *)((long)&local_120 + lVar27 + 4);
                pfVar28[-2] = fVar2 + fVar2 + fVar10;
                pfVar28[-1] = fVar4 * 4.0 + fVar3;
                *pfVar28 = fVar10 + fVar1 + fVar2 * 8.0;
                lVar27 = lVar27 + 0x18;
                pfVar28 = pfVar28 + local_2a8.w;
              } while (lVar27 != 0x74);
              uVar42 = uVar42 + 1;
              lVar39 = lVar39 + 4;
              pvVar41 = (void *)((long)pvVar41 + 4);
              pvVar26 = (void *)((long)pvVar26 + 4);
              pvVar43 = (void *)((long)pvVar43 + 4);
              pvVar22 = (void *)((long)pvVar22 + 4);
              pvVar24 = (void *)((long)pvVar24 + 4);
              pfVar35 = pfVar35 + 4;
            } while (uVar42 != uVar21);
          }
          uVar36 = uVar36 + 1;
          local_2d0 = local_2d0 + lVar40;
          local_2c8 = (void *)((long)local_2c8 + lVar40);
          local_310 = (void *)((long)local_310 + lVar40);
          local_308 = (void *)((long)local_308 + lVar40);
          local_300 = (void *)((long)local_300 + lVar40);
          local_2f8 = (void *)((long)local_2f8 + lVar40);
          local_2b8._0_8_ = (float *)(local_2b8._0_8_ + lVar29 * 4);
        } while (uVar36 != local_240);
      }
      lVar34 = lVar34 + 1;
      local_2f0 = (long)&local_260->data + local_2f0;
      local_328 = (void *)((long)local_328 + (long)local_260);
      local_330 = (void *)((long)local_330 + (long)local_260);
      local_338 = (void *)((long)local_338 + (long)local_260);
      local_340 = (void *)((long)local_340 + (long)local_260);
      local_2e8 = (void *)((long)local_2e8 + (long)local_260);
      local_320 = (void *)((long)local_320 + lVar25);
    } while (lVar34 != local_250);
  }
  copy_cut_border(&local_2a8,local_1e8,0,local_2a8.h - local_1e8->h,0,local_2a8.w - local_1e8->w,
                  local_1e0);
  piVar9 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_2a8.allocator == (Allocator *)0x0) {
        if (local_2a8.data != (void *)0x0) {
          free(local_2a8.data);
        }
      }
      else {
        (*(local_2a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2a8.cstep = 0;
  auVar46 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
          auVar46 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
        auVar46 = SUB1612(SUB6416(ZEXT864(0),0) << 0x40,4);
      }
    }
  }
  local_188.cstep = 0;
  local_188.data = (void *)0x0;
  local_188.refcount._0_4_ = auVar46._4_4_;
  local_188.refcount._4_4_ = 0;
  local_188.elemsize = auVar46._0_8_;
  local_188.elempack = auVar46._8_4_;
  local_188.w = 0;
  local_188._48_8_ = auVar46._4_8_;
  local_188.c = 0;
  piVar9 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
  local_188.dims = local_188.refcount._4_4_;
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1d8.cstep = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.elemsize._0_4_ = 0;
  local_1d8.elemsize._4_4_ = 0;
  local_1d8.elempack = 0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.d = 0;
  local_1d8.c = 0;
  piVar9 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if (local_238.data != (void *)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;

    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, 4u, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}